

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall smf::Binasc::getVLV(Binasc *this,istream *infile,int *trackbytes)

{
  long in_RAX;
  uint uVar1;
  uchar ch;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::istream::read((char *)infile,(long)&uStack_28 + 7);
  *trackbytes = *trackbytes + 1;
  uVar1 = uStack_28._7_1_ & 0x7f;
  if (uStack_28 < 0) {
    do {
      std::istream::read((char *)infile,(long)&uStack_28 + 7);
      *trackbytes = *trackbytes + 1;
      uVar1 = uVar1 << 7 | uStack_28._7_1_ & 0x7f;
    } while (uStack_28 < 0);
  }
  return uVar1;
}

Assistant:

int Binasc::getVLV(std::istream& infile, int& trackbytes) {
	int output = 0;
	uchar ch;
	infile.read((char*)&ch, 1);
	trackbytes++;
	output = (output << 7) | (0x7f & ch);
	while (ch >= 0x80) {
		infile.read((char*)&ch, 1);
		trackbytes++;
		output = (output << 7) | (0x7f & ch);
	}
	return output;
}